

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<QString,QVariant>::tryEmplace_impl<QLatin1String_const&>
          (QHash<QString,_QVariant> *this,QLatin1String *key)

{
  piter it;
  iterator it_00;
  QLatin1StringView latin1;
  bool bVar1;
  bool bVar2;
  size_t bucket_00;
  QLatin1String *in_RSI;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<QString,_QVariant> detachGuard;
  Node<QString,_QVariant> *in_stack_ffffffffffffff28;
  Node<QString,_QVariant> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  Data<QHashPrivate::Node<QString,_QVariant>_> *d;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffff58;
  qsizetype in_stack_ffffffffffffff60;
  Bucket local_30;
  Bucket local_20;
  QHash<QString,_QVariant> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d = in_RDI;
  if (in_RSI->m_size == 0) {
    QHash<QString,_QVariant>::detach((QHash<QString,_QVariant> *)in_stack_ffffffffffffff30);
  }
  local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<QString,_QVariant>::QHash(&local_10);
  QHashPrivate::calculateHash<QLatin1String>
            ((QLatin1String *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (size_t)in_stack_ffffffffffffff30);
  local_20.index = 0xaaaaaaaaaaaaaaaa;
  local_20.span = (Span *)0xaaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
             findBucketWithHash<QLatin1String>(in_stack_ffffffffffffff58,in_RSI,(size_t)d);
  bVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::isUnused
                    ((Bucket *)0x20d736);
  bVar2 = QHash<QString,_QVariant>::isDetached
                    ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff30);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::shouldGrow
                                   ((Data<QHashPrivate::Node<QString,_QVariant>_> *)in_RSI->m_size),
                bVar2)))) {
    QHash<QString,_QVariant>::operator=
              ((QHash<QString,_QVariant> *)in_RDI,
               (QHash<QString,_QVariant> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::shouldGrow
                        ((Data<QHashPrivate::Node<QString,_QVariant>_> *)in_RSI->m_size);
    }
    in_stack_ffffffffffffff3f = bVar2;
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::toBucketIndex
                          (&local_20,(Data<QHashPrivate::Node<QString,_QVariant>_> *)in_RSI->m_size)
    ;
    if (bVar2 == false) {
      in_stack_ffffffffffffff30 =
           (Node<QString,_QVariant> *)
           QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached(d);
    }
    else {
      in_stack_ffffffffffffff30 =
           (Node<QString,_QVariant> *)
           QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached(d,(size_t)in_RDI);
    }
    in_RSI->m_size = (qsizetype)in_stack_ffffffffffffff30;
    if (bVar2 == false) {
      QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::Bucket
                (&local_30,(Data<QHashPrivate::Node<QString,_QVariant>_> *)in_RSI->m_size,bucket_00)
      ;
    }
    else {
      local_30 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
                 findBucketWithHash<QLatin1String>(in_stack_ffffffffffffff58,in_RSI,(size_t)d);
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff28 =
         QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::insert
                   ((Bucket *)0x20d889);
    latin1.m_data = (char *)in_stack_ffffffffffffff28;
    latin1.m_size = in_stack_ffffffffffffff60;
    QString::QString((QString *)in_RDI,latin1);
    QHashPrivate::Node<QString,_QVariant>::createInPlace<>
              (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->key);
    QString::~QString((QString *)0x20d8ee);
    *(long *)(in_RSI->m_size + 8) = *(long *)(in_RSI->m_size + 8) + 1;
  }
  QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::toIterator
            ((Bucket *)in_stack_ffffffffffffff30,
             (Data<QHashPrivate::Node<QString,_QVariant>_> *)in_stack_ffffffffffffff28);
  it.bucket._0_7_ = in_stack_ffffffffffffff38;
  it.d = (Data<QHashPrivate::Node<QString,_QVariant>_> *)in_stack_ffffffffffffff30;
  it.bucket._7_1_ = in_stack_ffffffffffffff3f;
  QHash<QString,_QVariant>::iterator::iterator((iterator *)in_stack_ffffffffffffff28,it);
  it_00.i.bucket._0_7_ = in_stack_ffffffffffffff38;
  it_00.i.d = (Data<QHashPrivate::Node<QString,_QVariant>_> *)in_stack_ffffffffffffff30;
  it_00.i.bucket._7_1_ = in_stack_ffffffffffffff3f;
  QHash<QString,_QVariant>::TryEmplaceResult::TryEmplaceResult
            ((TryEmplaceResult *)in_stack_ffffffffffffff28,it_00,false);
  QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)d;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }